

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenNativeTablePost(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  string native_name;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((this->opts_).super_IDLOptions.gen_compare == true) {
    EscapeKeyword(&local_a0,this,(string *)struct_def);
    NativeName(&local_40,&local_a0,struct_def,&(this->opts_).super_IDLOptions);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"STRUCT_NAME",&local_a1);
    EscapeKeyword(&local_80,this,(string *)struct_def);
    this_00 = &this->code_;
    CodeWriter::SetValue(this_00,&local_a0,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"NATIVE_NAME",(allocator<char> *)&local_80);
    CodeWriter::SetValue(this_00,&local_a0,&local_40);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"",(allocator<char> *)&local_80);
    GenCompareOperator(this,struct_def,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"",(allocator<char> *)&local_a0);
    CodeWriter::operator+=(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void GenNativeTablePost(const StructDef &struct_def) {
    if (opts_.gen_compare) {
      const auto native_name = NativeName(Name(struct_def), &struct_def, opts_);
      code_.SetValue("STRUCT_NAME", Name(struct_def));
      code_.SetValue("NATIVE_NAME", native_name);
      GenCompareOperator(struct_def);
      code_ += "";
    }
  }